

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_string_with_len(char *string,size_t length)

{
  parson_bool_t pVar1;
  char *string_00;
  JSON_Value *value;
  char *copy;
  size_t length_local;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    pVar1 = is_valid_utf8(string,length);
    if (pVar1 == 0) {
      string_local = (char *)0x0;
    }
    else {
      string_00 = parson_strndup(string,length);
      if (string_00 == (char *)0x0) {
        string_local = (char *)0x0;
      }
      else {
        string_local = (char *)json_value_init_string_no_copy(string_00,length);
        if ((JSON_Value *)string_local == (JSON_Value *)0x0) {
          (*parson_free)(string_00);
        }
      }
    }
  }
  return (JSON_Value *)string_local;
}

Assistant:

JSON_Value * json_value_init_string_with_len(const char *string, size_t length) {
    char *copy = NULL;
    JSON_Value *value;
    if (string == NULL) {
        return NULL;
    }
    if (!is_valid_utf8(string, length)) {
        return NULL;
    }
    copy = parson_strndup(string, length);
    if (copy == NULL) {
        return NULL;
    }
    value = json_value_init_string_no_copy(copy, length);
    if (value == NULL) {
        parson_free(copy);
    }
    return value;
}